

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

double ** multiply_matrix(double **x,int m,int n,double **y,int v,int b)

{
  double **ppdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  allocator local_55;
  int local_54;
  string local_50;
  
  uVar3 = 1;
  local_54 = v;
  ppdVar1 = matrix(1,(long)m,1,(long)b);
  if (n != local_54) {
    std::__cxx11::string::string
              ((string *)&local_50,"bad dimensions in mulitply_matrix()",&local_55);
    nrerror(&local_50);
  }
  uVar6 = (ulong)(uint)b;
  if (b < 1) {
    uVar6 = 0;
  }
  if (m < 1) {
    m = 0;
  }
  for (; uVar2 = 0, uVar3 != m + 1; uVar3 = uVar3 + 1) {
    for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      ppdVar1[uVar3][uVar2 + 1] = 0.0;
    }
  }
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (uVar2 = 1; uVar4 = 1, uVar2 != m + 1; uVar2 = uVar2 + 1) {
    for (; uVar4 != (int)uVar6 + 1; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        ppdVar1[uVar2][uVar4] = x[uVar2][uVar5 + 1] * y[uVar5 + 1][uVar4] + ppdVar1[uVar2][uVar4];
      }
    }
  }
  return ppdVar1;
}

Assistant:

double **multiply_matrix(double **x, int m, int n, double **y, int v, int b) {
    int k, l, j;
    double **tmp;

    tmp = matrix(1, m, 1, b);
    if (n != v) nrerror("bad dimensions in mulitply_matrix()");
    for (k = 1; k <= m; k++)
        for (l = 1; l <= b; l++)
            tmp[k][l] = 0;

    for (k = 1; k <= m; k++) {     /* row of x */
        for (l = 1; l <= b; l++) {    /* column of x */

            for (j = 1; j <= v; j++) {
                tmp[k][l] += x[k][j] * y[j][l];
            }
        }
    }
    return tmp;
}